

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::CustomHeap::Allocation,_RealCount>::RemoveElement<Memory::ArenaAllocator>
          (DListBase<Memory::CustomHeap::Allocation,_RealCount> *this,ArenaAllocator *allocator,
          Allocation *element)

{
  code *pcVar1;
  bool bVar2;
  undefined1 *obj;
  undefined4 *puVar3;
  Node *node;
  Allocation *element_local;
  ArenaAllocator *allocator_local;
  DListBase<Memory::CustomHeap::Allocation,_RealCount> *this_local;
  
  obj = &element[-1].field_0x28;
  bVar2 = HasNode(this,(NodeBase *)obj);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RemoveNode((NodeBase *)obj);
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::CustomHeap::Allocation>>
            (allocator,(DListNode<Memory::CustomHeap::Allocation> *)obj);
  RealCount::DecrementCount(&this->super_RealCount);
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }